

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecificationElement.cpp
# Opt level: O2

void __thiscall
DIS::RecordSpecificationElement::marshal(RecordSpecificationElement *this,DataStream *dataStream)

{
  DataStream::operator<<(dataStream,this->_recordID);
  DataStream::operator<<(dataStream,this->_recordSetSerialNumber);
  DataStream::operator<<(dataStream,this->_recordLength);
  DataStream::operator<<(dataStream,this->_recordCount);
  DataStream::operator<<(dataStream,this->_recordValues);
  DataStream::operator<<(dataStream,this->_pad4);
  return;
}

Assistant:

void RecordSpecificationElement::marshal(DataStream& dataStream) const
{
    dataStream << _recordID;
    dataStream << _recordSetSerialNumber;
    dataStream << _recordLength;
    dataStream << _recordCount;
    dataStream << _recordValues;
    dataStream << _pad4;
}